

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O3

int __thiscall pstore::region::file_based_factory::init(file_based_factory *this,EVP_PKEY_CTX *ctx)

{
  shared_ptr<pstore::file::file_handle> local_18;
  
  local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(ctx + 0x18);
  local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 0x20);
  if (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  factory::create<pstore::file::file_handle,pstore::memory_mapper>
            ((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)this,(factory *)ctx,&local_18);
  if (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (int)this;
}

Assistant:

auto file_based_factory::init () -> std::vector<memory_mapper_ptr> {
            return this->create<file::file_handle, memory_mapper> (file_);
        }